

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestMultiProcessHandler.cxx
# Opt level: O2

void __thiscall
cmCTestMultiProcessHandler::CreateSerialTestCostList(cmCTestMultiProcessHandler *this)

{
  _Rb_tree_header *p_Var1;
  TestList *this_00;
  _Base_ptr p_Var2;
  iterator iVar3;
  pointer piVar4;
  pointer piVar5;
  int test;
  int testDependency;
  TestList dependencies;
  TestList presortedList;
  TestSet alreadySortedTests;
  int local_b0;
  key_type local_ac;
  _Vector_base<int,_std::allocator<int>_> local_a8;
  _Vector_base<int,_std::allocator<int>_> local_88;
  cmCTestMultiProcessHandler *local_70;
  TestComparator local_68;
  _Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_> local_60;
  
  local_88._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_88._M_impl.super__Vector_impl_data._M_start = (int *)0x0;
  local_88._M_impl.super__Vector_impl_data._M_finish = (int *)0x0;
  for (p_Var2 = (this->Tests).
                super_map<int,_cmCTestMultiProcessHandler::TestSet,_std::less<int>,_std::allocator<std::pair<const_int,_cmCTestMultiProcessHandler::TestSet>_>_>
                ._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var2 !=
      &(this->Tests).
       super_map<int,_cmCTestMultiProcessHandler::TestSet,_std::less<int>,_std::allocator<std::pair<const_int,_cmCTestMultiProcessHandler::TestSet>_>_>
       ._M_t._M_impl.super__Rb_tree_header; p_Var2 = (_Base_ptr)std::_Rb_tree_increment(p_Var2)) {
    std::vector<int,_std::allocator<int>_>::push_back
              ((vector<int,_std::allocator<int>_> *)&local_88,(value_type_conflict2 *)(p_Var2 + 1));
  }
  local_68.Handler = this;
  std::
  stable_sort<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,TestComparator>
            ((__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)
             local_88._M_impl.super__Vector_impl_data._M_start,
             (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)
             local_88._M_impl.super__Vector_impl_data._M_finish,&local_68);
  p_Var1 = &local_60._M_impl.super__Rb_tree_header;
  local_60._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_60._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_60._M_impl.super__Rb_tree_header._M_node_count = 0;
  this_00 = &this->SortedTests;
  piVar5 = local_88._M_impl.super__Vector_impl_data._M_start;
  local_70 = this;
  local_60._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  local_60._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  for (; piVar5 != local_88._M_impl.super__Vector_impl_data._M_finish; piVar5 = piVar5 + 1) {
    local_b0 = *piVar5;
    iVar3 = std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::find
                      (&local_60,&local_b0);
    if ((_Rb_tree_header *)iVar3._M_node == p_Var1) {
      local_a8._M_impl.super__Vector_impl_data._M_start = (key_type *)0x0;
      local_a8._M_impl.super__Vector_impl_data._M_finish = (key_type *)0x0;
      local_a8._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      GetAllTestDependencies(this,local_b0,(TestList *)&local_a8);
      for (piVar4 = local_a8._M_impl.super__Vector_impl_data._M_start;
          piVar4 != local_a8._M_impl.super__Vector_impl_data._M_finish; piVar4 = piVar4 + 1) {
        local_ac = *piVar4;
        iVar3 = std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::
                find(&local_60,&local_ac);
        if ((_Rb_tree_header *)iVar3._M_node == p_Var1) {
          std::_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>>::
          _M_insert_unique<int_const&>
                    ((_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>> *)
                     &local_60,&local_ac);
          std::vector<int,_std::allocator<int>_>::push_back
                    (&this_00->super_vector<int,_std::allocator<int>_>,&local_ac);
        }
      }
      std::_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>>::
      _M_insert_unique<int_const&>
                ((_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>> *)
                 &local_60,&local_b0);
      std::vector<int,_std::allocator<int>_>::push_back
                (&this_00->super_vector<int,_std::allocator<int>_>,&local_b0);
      std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base(&local_a8);
      this = local_70;
    }
  }
  std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::~_Rb_tree
            (&local_60);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base(&local_88);
  return;
}

Assistant:

void cmCTestMultiProcessHandler::CreateSerialTestCostList()
{
  TestList presortedList;

  for (TestMap::iterator i = this->Tests.begin(); i != this->Tests.end();
       ++i) {
    presortedList.push_back(i->first);
  }

  TestComparator comp(this);
  std::stable_sort(presortedList.begin(), presortedList.end(), comp);

  TestSet alreadySortedTests;

  for (TestList::const_iterator i = presortedList.begin();
       i != presortedList.end(); ++i) {
    int test = *i;

    if (alreadySortedTests.find(test) != alreadySortedTests.end()) {
      continue;
    }

    TestList dependencies;
    GetAllTestDependencies(test, dependencies);

    for (TestList::const_iterator j = dependencies.begin();
         j != dependencies.end(); ++j) {
      int testDependency = *j;

      if (alreadySortedTests.find(testDependency) ==
          alreadySortedTests.end()) {
        alreadySortedTests.insert(testDependency);
        this->SortedTests.push_back(testDependency);
      }
    }

    alreadySortedTests.insert(test);
    this->SortedTests.push_back(test);
  }
}